

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ELU_x86_avx512::forward_inplace(ELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  _func_int **pp_Var3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  long lVar11;
  undefined1 (*pauVar12) [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar13 [16];
  undefined1 auVar23 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 extraout_var [60];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float afVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float afVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar54 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar29 [32];
  undefined1 auVar21 [16];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    pp_Var3 = this->_vptr_ELU_x86_avx512;
    auVar30 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar31 = vxorps_avx512dq(auVar30,(undefined1  [64])_ps512_cephes_exp_C1);
    auVar30 = vxorps_avx512dq(auVar30,(undefined1  [64])_ps512_cephes_exp_C2);
    lVar9 = 0;
    auVar13 = vxorps_avx512vl(in_ZMM20._0_16_,in_ZMM20._0_16_);
    auVar54 = ZEXT1664(auVar13);
    auVar13 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar55 = ZEXT1664(auVar13);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar56 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar57 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar58 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar60 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar61 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar62 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar63 = ZEXT3264(auVar23);
    auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar64 = ZEXT3264(auVar23);
    afVar41 = _ps512_1;
    afVar50 = _ps512_cephes_exp_p5;
    do {
      pauVar12 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar9 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar10 < 0x10) {
        uVar8 = 0;
      }
      else {
        auVar32 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var3[-3])));
        iVar6 = 0xf;
        do {
          auVar33 = vmaxps_avx512f(*pauVar12,auVar54);
          auVar34 = vminps_avx512f(*pauVar12,auVar54);
          auVar34 = vminps_avx512f(auVar34,(undefined1  [64])_ps512_exp_hi);
          auVar34 = vmaxps_avx512f(auVar34,(undefined1  [64])_ps512_exp_lo);
          auVar35 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_LOG2EF,auVar34,
                                        (undefined1  [64])afVar50);
          auVar36 = vrndscaleps_avx512f(auVar35,1);
          uVar5 = vcmpps_avx512f(auVar35,auVar36,1);
          auVar35 = vsubps_avx512f(auVar36,(undefined1  [64])afVar41);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar37._0_4_ = (uint)bVar4 * auVar35._0_4_ | (uint)!bVar4 * auVar36._0_4_;
          bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar37._4_4_ = (uint)bVar4 * auVar35._4_4_ | (uint)!bVar4 * auVar36._4_4_;
          bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar37._8_4_ = (uint)bVar4 * auVar35._8_4_ | (uint)!bVar4 * auVar36._8_4_;
          bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar37._12_4_ = (uint)bVar4 * auVar35._12_4_ | (uint)!bVar4 * auVar36._12_4_;
          bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
          auVar37._16_4_ = (uint)bVar4 * auVar35._16_4_ | (uint)!bVar4 * auVar36._16_4_;
          bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
          auVar37._20_4_ = (uint)bVar4 * auVar35._20_4_ | (uint)!bVar4 * auVar36._20_4_;
          bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
          auVar37._24_4_ = (uint)bVar4 * auVar35._24_4_ | (uint)!bVar4 * auVar36._24_4_;
          bVar4 = (bool)((byte)(uVar5 >> 7) & 1);
          auVar37._28_4_ = (uint)bVar4 * auVar35._28_4_ | (uint)!bVar4 * auVar36._28_4_;
          bVar4 = (bool)((byte)(uVar5 >> 8) & 1);
          auVar37._32_4_ = (uint)bVar4 * auVar35._32_4_ | (uint)!bVar4 * auVar36._32_4_;
          bVar4 = (bool)((byte)(uVar5 >> 9) & 1);
          auVar37._36_4_ = (uint)bVar4 * auVar35._36_4_ | (uint)!bVar4 * auVar36._36_4_;
          bVar4 = (bool)((byte)(uVar5 >> 10) & 1);
          auVar37._40_4_ = (uint)bVar4 * auVar35._40_4_ | (uint)!bVar4 * auVar36._40_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xb) & 1);
          auVar37._44_4_ = (uint)bVar4 * auVar35._44_4_ | (uint)!bVar4 * auVar36._44_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xc) & 1);
          auVar37._48_4_ = (uint)bVar4 * auVar35._48_4_ | (uint)!bVar4 * auVar36._48_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xd) & 1);
          auVar37._52_4_ = (uint)bVar4 * auVar35._52_4_ | (uint)!bVar4 * auVar36._52_4_;
          bVar4 = (bool)((byte)(uVar5 >> 0xe) & 1);
          auVar37._56_4_ = (uint)bVar4 * auVar35._56_4_ | (uint)!bVar4 * auVar36._56_4_;
          bVar4 = SUB81(uVar5 >> 0xf,0);
          auVar37._60_4_ = (uint)bVar4 * auVar35._60_4_ | (uint)!bVar4 * auVar36._60_4_;
          auVar34 = vfmadd231ps_avx512f(auVar34,auVar37,auVar31);
          auVar34 = vfmadd231ps_avx512f(auVar34,auVar37,auVar30);
          auVar35 = vmulps_avx512f(auVar34,auVar34);
          auVar36 = vfmadd132ps_avx512f(auVar34,(undefined1  [64])_ps512_cephes_exp_p1,
                                        (undefined1  [64])_ps512_cephes_exp_p0);
          auVar36 = vfmadd213ps_avx512f(auVar36,auVar34,(undefined1  [64])_ps512_cephes_exp_p2);
          auVar36 = vfmadd213ps_avx512f(auVar36,auVar34,(undefined1  [64])_ps512_cephes_exp_p3);
          auVar36 = vfmadd213ps_avx512f(auVar36,auVar34,(undefined1  [64])_ps512_cephes_exp_p4);
          auVar36 = vfmadd213ps_avx512f(auVar36,auVar34,(undefined1  [64])afVar50);
          auVar34 = vfmadd213ps_avx512f(auVar36,auVar35,auVar34);
          auVar35 = vaddps_avx512f(auVar34,(undefined1  [64])afVar41);
          auVar34 = vcvttps2dq_avx512f(auVar37);
          auVar34 = vpaddd_avx512f(auVar34,(undefined1  [64])_pi32_512_0x7f);
          auVar36 = vpslld_avx512f(auVar34,0x17);
          auVar34._8_4_ = 0xbf800000;
          auVar34._0_8_ = 0xbf800000bf800000;
          auVar34._12_4_ = 0xbf800000;
          auVar34._16_4_ = 0xbf800000;
          auVar34._20_4_ = 0xbf800000;
          auVar34._24_4_ = 0xbf800000;
          auVar34._28_4_ = 0xbf800000;
          auVar34._32_4_ = 0xbf800000;
          auVar34._36_4_ = 0xbf800000;
          auVar34._40_4_ = 0xbf800000;
          auVar34._44_4_ = 0xbf800000;
          auVar34._48_4_ = 0xbf800000;
          auVar34._52_4_ = 0xbf800000;
          auVar34._56_4_ = 0xbf800000;
          auVar34._60_4_ = 0xbf800000;
          auVar34 = vfmadd213ps_avx512f(auVar36,auVar35,auVar34);
          auVar34 = vfmadd213ps_avx512f(auVar34,auVar32,auVar33);
          *pauVar12 = auVar34;
          pauVar12 = pauVar12 + 1;
          iVar6 = iVar6 + 0x10;
          uVar8 = uVar10 & 0xfffffff0;
        } while (iVar6 < (int)uVar10);
      }
      if ((int)(uVar8 | 7) < (int)uVar10) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar23._4_4_ = uVar1;
        auVar23._0_4_ = uVar1;
        auVar23._8_4_ = uVar1;
        auVar23._12_4_ = uVar1;
        auVar23._16_4_ = uVar1;
        auVar23._20_4_ = uVar1;
        auVar23._24_4_ = uVar1;
        auVar23._28_4_ = uVar1;
        auVar43._8_4_ = 0x3d2aa9c1;
        auVar43._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar43._12_4_ = 0x3d2aa9c1;
        auVar43._16_4_ = 0x3d2aa9c1;
        auVar43._20_4_ = 0x3d2aa9c1;
        auVar43._24_4_ = 0x3d2aa9c1;
        auVar43._28_4_ = 0x3d2aa9c1;
        auVar45._8_4_ = 0x3e2aaaaa;
        auVar45._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar45._12_4_ = 0x3e2aaaaa;
        auVar45._16_4_ = 0x3e2aaaaa;
        auVar45._20_4_ = 0x3e2aaaaa;
        auVar45._24_4_ = 0x3e2aaaaa;
        auVar45._28_4_ = 0x3e2aaaaa;
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar47._16_4_ = 0x3f800000;
        auVar47._20_4_ = 0x3f800000;
        auVar47._24_4_ = 0x3f800000;
        auVar47._28_4_ = 0x3f800000;
        uVar7 = uVar8;
        do {
          auVar24 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar12,auVar55._0_32_);
          auVar25 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar12,auVar55._0_32_);
          auVar26._8_4_ = 0x42b0c0a5;
          auVar26._0_8_ = 0x42b0c0a542b0c0a5;
          auVar26._12_4_ = 0x42b0c0a5;
          auVar26._16_4_ = 0x42b0c0a5;
          auVar26._20_4_ = 0x42b0c0a5;
          auVar26._24_4_ = 0x42b0c0a5;
          auVar26._28_4_ = 0x42b0c0a5;
          auVar26 = vminps_avx512vl(auVar25,auVar26);
          auVar25 = vmaxps_avx512vl(auVar26,auVar56._0_32_);
          auVar27 = vfmadd231ps_avx512vl(auVar57._0_32_,auVar25,auVar58._0_32_);
          auVar26 = vroundps_avx(auVar27,1);
          uVar5 = vcmpps_avx512vl(auVar27,auVar26,1);
          auVar59 = auVar60._0_32_;
          auVar28 = vsubps_avx512vl(auVar26,auVar59);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar29._0_4_ = (float)((uint)bVar4 * auVar28._0_4_ | (uint)!bVar4 * auVar26._0_4_);
          bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar29._4_4_ = (float)((uint)bVar4 * auVar28._4_4_ | (uint)!bVar4 * auVar26._4_4_);
          bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar29._8_4_ = (float)((uint)bVar4 * auVar28._8_4_ | (uint)!bVar4 * auVar26._8_4_);
          bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar29._12_4_ = (float)((uint)bVar4 * auVar28._12_4_ | (uint)!bVar4 * auVar26._12_4_);
          bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
          auVar29._16_4_ = (float)((uint)bVar4 * auVar28._16_4_ | (uint)!bVar4 * auVar26._16_4_);
          bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
          auVar29._20_4_ = (float)((uint)bVar4 * auVar28._20_4_ | (uint)!bVar4 * auVar26._20_4_);
          bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
          auVar29._24_4_ = (float)((uint)bVar4 * auVar28._24_4_ | (uint)!bVar4 * auVar26._24_4_);
          bVar4 = SUB81(uVar5 >> 7,0);
          auVar29._28_4_ = (float)((uint)bVar4 * auVar28._28_4_ | (uint)!bVar4 * auVar26._28_4_);
          auVar26 = vfmsub231ps_avx512vl(auVar25,auVar29,auVar61._0_32_);
          auVar25._8_4_ = 0x395e8083;
          auVar25._0_8_ = 0x395e8083395e8083;
          auVar25._12_4_ = 0x395e8083;
          auVar25._16_4_ = 0x395e8083;
          auVar25._20_4_ = 0x395e8083;
          auVar25._24_4_ = 0x395e8083;
          auVar25._28_4_ = 0x395e8083;
          auVar26 = vfmsub231ps_avx512vl(auVar26,auVar29,auVar25);
          auVar28._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar28._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar28._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar28._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar28._16_4_ = auVar26._16_4_ * auVar26._16_4_;
          auVar28._20_4_ = auVar26._20_4_ * auVar26._20_4_;
          auVar28._24_4_ = auVar26._24_4_ * auVar26._24_4_;
          auVar28._28_4_ = auVar27._28_4_;
          auVar25 = vfmadd213ps_avx512vl(auVar62._0_32_,auVar26,auVar63._0_32_);
          auVar25 = vfmadd213ps_avx512vl(auVar25,auVar26,auVar64._0_32_);
          auVar13 = vfmadd213ps_fma(auVar25,auVar26,auVar43);
          auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar26,auVar45);
          auVar25 = vfmadd213ps_avx512vl(ZEXT1632(auVar13),auVar26,auVar57._0_32_);
          auVar13 = vfmadd213ps_fma(auVar25,auVar28,auVar26);
          auVar25 = vaddps_avx512vl(ZEXT1632(auVar13),auVar59);
          auVar27._0_4_ = (int)auVar29._0_4_;
          auVar27._4_4_ = (int)auVar29._4_4_;
          auVar27._8_4_ = (int)auVar29._8_4_;
          auVar27._12_4_ = (int)auVar29._12_4_;
          auVar27._16_4_ = (int)auVar29._16_4_;
          auVar27._20_4_ = (int)auVar29._20_4_;
          auVar27._24_4_ = (int)auVar29._24_4_;
          auVar27._28_4_ = (int)auVar29._28_4_;
          auVar26 = vpslld_avx2(auVar27,0x17);
          auVar26 = vpaddd_avx2(auVar47,auVar26);
          auVar26 = vfmsub213ps_avx512vl(auVar26,auVar25,auVar59);
          auVar13 = vfmadd213ps_fma(auVar26,auVar23,auVar24);
          *(undefined1 (*) [32])*pauVar12 = ZEXT1632(auVar13);
          pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x20);
          uVar8 = uVar7 + 8;
          iVar6 = uVar7 + 0xf;
          uVar7 = uVar8;
        } while (iVar6 < (int)uVar10);
      }
      if ((int)(uVar8 | 3) < (int)uVar10) {
        uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
        auVar38._4_4_ = uVar1;
        auVar38._0_4_ = uVar1;
        auVar38._8_4_ = uVar1;
        auVar38._12_4_ = uVar1;
        auVar42._8_4_ = 0x42b0c0a5;
        auVar42._0_8_ = 0x42b0c0a542b0c0a5;
        auVar42._12_4_ = 0x42b0c0a5;
        auVar44._8_4_ = 0xc2b0c0a5;
        auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar44._12_4_ = 0xc2b0c0a5;
        auVar46._8_4_ = 0x3f000000;
        auVar46._0_8_ = 0x3f0000003f000000;
        auVar46._12_4_ = 0x3f000000;
        auVar48._8_4_ = 0x3fb8aa3b;
        auVar48._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar48._12_4_ = 0x3fb8aa3b;
        auVar49._8_4_ = 0x3f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar49._12_4_ = 0x3f800000;
        auVar51._8_4_ = 0x3f318000;
        auVar51._0_8_ = 0x3f3180003f318000;
        auVar51._12_4_ = 0x3f318000;
        auVar52._8_4_ = 0x395e8083;
        auVar52._0_8_ = 0x395e8083395e8083;
        auVar52._12_4_ = 0x395e8083;
        auVar13 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar14 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar53._8_4_ = 0x3c088908;
        auVar53._0_8_ = 0x3c0889083c088908;
        auVar53._12_4_ = 0x3c088908;
        auVar15 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar16 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar17 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        in_ZMM22 = ZEXT1664(auVar17);
        auVar18 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar7 = uVar8;
        do {
          auVar19 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar12,auVar17);
          auVar20 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar12,auVar17);
          auVar20 = vminps_avx(auVar20,auVar42);
          auVar39 = vmaxps_avx(auVar44,auVar20);
          auVar22 = vfmadd231ps_fma(auVar46,auVar39,auVar48);
          auVar40._0_4_ = (int)auVar22._0_4_;
          auVar40._4_4_ = (int)auVar22._4_4_;
          auVar40._8_4_ = (int)auVar22._8_4_;
          auVar40._12_4_ = (int)auVar22._12_4_;
          auVar20 = vcvtdq2ps_avx(auVar40);
          uVar5 = vcmpps_avx512vl(auVar22,auVar20,1);
          auVar21 = vsubps_avx512vl(auVar20,auVar49);
          bVar4 = (bool)((byte)uVar5 & 1);
          auVar22._0_4_ = (float)((uint)bVar4 * auVar21._0_4_ | (uint)!bVar4 * auVar20._0_4_);
          bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
          auVar22._4_4_ = (float)((uint)bVar4 * auVar21._4_4_ | (uint)!bVar4 * auVar20._4_4_);
          bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
          auVar22._8_4_ = (float)((uint)bVar4 * auVar21._8_4_ | (uint)!bVar4 * auVar20._8_4_);
          bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
          auVar22._12_4_ = (float)((uint)bVar4 * auVar21._12_4_ | (uint)!bVar4 * auVar20._12_4_);
          auVar20 = vfmsub231ps_fma(auVar39,auVar22,auVar51);
          auVar39 = vfmsub231ps_fma(auVar20,auVar22,auVar52);
          auVar21._0_4_ = auVar39._0_4_ * auVar39._0_4_;
          auVar21._4_4_ = auVar39._4_4_ * auVar39._4_4_;
          auVar21._8_4_ = auVar39._8_4_ * auVar39._8_4_;
          auVar21._12_4_ = auVar39._12_4_ * auVar39._12_4_;
          auVar20 = vfmadd213ps_avx512vl(auVar13,auVar39,auVar14);
          auVar20 = vfmadd213ps_fma(auVar20,auVar39,auVar53);
          auVar20 = vfmadd213ps_avx512vl(auVar20,auVar39,auVar15);
          auVar20 = vfmadd213ps_avx512vl(auVar20,auVar39,auVar16);
          auVar20 = vfmadd213ps_fma(auVar20,auVar39,auVar46);
          auVar20 = vfmadd213ps_fma(auVar20,auVar21,auVar39);
          auVar39._0_4_ = auVar20._0_4_ + 1.0;
          auVar39._4_4_ = auVar20._4_4_ + 1.0;
          auVar39._8_4_ = auVar20._8_4_ + 1.0;
          auVar39._12_4_ = auVar20._12_4_ + 1.0;
          auVar20._0_4_ = (int)auVar22._0_4_;
          auVar20._4_4_ = (int)auVar22._4_4_;
          auVar20._8_4_ = (int)auVar22._8_4_;
          auVar20._12_4_ = (int)auVar22._12_4_;
          auVar20 = vpslld_avx(auVar20,0x17);
          auVar20 = vpaddd_avx512vl(auVar20,auVar18);
          auVar20 = vfmsub213ps_fma(auVar20,auVar39,auVar49);
          auVar20 = vfmadd213ps_fma(auVar20,auVar38,auVar19);
          *(undefined1 (*) [16])*pauVar12 = auVar20;
          pauVar12 = (undefined1 (*) [64])(*pauVar12 + 0x10);
          uVar8 = uVar7 + 4;
          iVar6 = uVar7 + 7;
          uVar7 = uVar8;
        } while (iVar6 < (int)uVar10);
      }
      if (uVar10 - uVar8 != 0 && (int)uVar8 <= (int)uVar10) {
        lVar11 = 0;
        do {
          auVar13 = auVar54._0_16_;
          auVar14 = auVar55._0_16_;
          if (*(float *)(*pauVar12 + lVar11 * 4) < 0.0) {
            uVar7 = *(uint *)(&this->field_0xd0 + (long)pp_Var3[-3]);
            auVar32._0_4_ = expf(*(float *)(*pauVar12 + lVar11 * 4));
            afVar50 = _ps512_cephes_exp_p5;
            afVar41 = _ps512_1;
            auVar32._4_60_ = extraout_var;
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar64 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar63 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar62 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar61 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar60 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar58 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar57 = ZEXT3264(auVar23);
            auVar23 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar56 = ZEXT3264(auVar23);
            auVar14 = vxorps_avx512vl(auVar14,auVar14);
            auVar55 = ZEXT1664(auVar14);
            auVar13 = vxorps_avx512vl(auVar13,auVar13);
            auVar54 = ZEXT1664(auVar13);
            auVar13 = vfmsub213ss_fma(auVar32._0_16_,ZEXT416(uVar7),ZEXT416(uVar7));
            *(int *)(*pauVar12 + lVar11 * 4) = auVar13._0_4_;
          }
          lVar11 = lVar11 + 1;
        } while (uVar10 - uVar8 != (int)lVar11);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar2);
  }
  return 0;
}

Assistant:

int ELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}